

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>,true>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  char cVar1;
  uchar localRegisterID;
  byte bVar2;
  ProfileId profileId;
  ProfileId PVar3;
  Type ppvVar4;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  long lVar5;
  AuxArray<unsigned_int> *spreadIndices_00;
  uint uVar6;
  Var pvVar7;
  void **__s;
  uint uVar8;
  Type TVar9;
  void *apvStack_e0 [2];
  Var stackArgs [8];
  Arguments local_90;
  Arguments local_80;
  Arguments local_70;
  Arguments local_60;
  Arguments local_50;
  AuxArray<unsigned_int> *local_40;
  Type local_38;
  
  __s = apvStack_e0 + 1;
  TVar9 = (Type)((ulong)playout->ArgCount | 0x1000000);
  ppvVar4 = *(Type *)(this + 0x28);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    cVar1 = playout->Return;
    apvStack_e0[0] = (void *)0x98157a;
    pvVar7 = GetReg<unsigned_char>(this,playout->Function);
    PVar3._0_1_ = playout[1].ArgCount;
    PVar3._1_1_ = playout[1].Return;
    apvStack_e0[0] = (void *)0x98159e;
    local_60.Info = TVar9;
    local_60.Values = ppvVar4;
    pvVar7 = ProfilingHelpers::ProfiledNewScObjArray
                       (pvVar7,&local_60,*(ScriptFunction **)(this + 0x80),PVar3,
                        *(ProfileId *)&playout[1].Function);
  }
  else {
    apvStack_e0[0] = (void *)0x981509;
    local_90.Info = TVar9;
    local_90.Values = ppvVar4;
    local_40 = spreadIndices;
    local_38 = ppvVar4;
    uVar6 = JavascriptFunction::GetSpreadSize
                      (&local_90,spreadIndices,*(ScriptContext **)(this + 0x78));
    uVar8 = (uVar6 & 0xffffff) + 0x1000000;
    local_50.Info._4_4_ = 0;
    local_50.Info._0_4_ = uVar8;
    if ((uVar6 & 0xffffff) < 9) {
      __s = apvStack_e0 + 1;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      apvStack_e0[1] = (void *)0x0;
      stackArgs[0] = (Var)0x0;
    }
    else {
      uVar8 = uVar8 * 8 & 0x7fffff8;
      apvStack_e0[0] = (void *)0x981547;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,(ulong)uVar8 + 0xc00,
                 *(ScriptContext **)(this + 0x78),(PVOID)0x0);
      lVar5 = -(ulong)(uVar8 + 0xf & 0xfffffff0);
      __s = (void **)((long)stackArgs + lVar5 + -8);
      *(undefined8 *)((long)apvStack_e0 + lVar5) = 0x981566;
      memset(__s,0,(ulong)uVar8);
    }
    spreadIndices_00 = local_40;
    local_80.Values = local_38;
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_80.Info = TVar9;
    local_50.Values = __s;
    __s[-1] = (void *)0x9815ef;
    JavascriptFunction::SpreadArgs(&local_80,&local_50,spreadIndices_00,scriptContext);
    cVar1 = playout->Return;
    localRegisterID = playout->Function;
    __s[-1] = (void *)0x981601;
    pvVar7 = GetReg<unsigned_char>(this,localRegisterID);
    local_70.Info = local_50.Info;
    local_70.Values = local_50.Values;
    caller = *(ScriptFunction **)(this + 0x80);
    profileId._0_1_ = playout[1].ArgCount;
    profileId._1_1_ = playout[1].Return;
    PVar3 = *(ProfileId *)&playout[1].Function;
    __s[-1] = (void *)0x981626;
    pvVar7 = ProfilingHelpers::ProfiledNewScObjArray(pvVar7,&local_70,caller,profileId,PVar3);
  }
  __s[-1] = (void *)0x981634;
  SetReg<unsigned_int>(this,(int)cVar1,pvVar7);
  bVar2 = playout->ArgCount;
  __s[-1] = (void *)0x981640;
  PopOut(this,(ushort)bVar2);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }